

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::anon_unknown_5::addExports
          (Result<wasm::Ok> *__return_storage_ptr__,Lexer *in,Module *wasm,Named *item,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ExternalKind kind)

{
  variant<wasm::Name,_wasm::HeapType> value;
  Name name_00;
  bool bVar1;
  reference pNVar2;
  Export *pEVar3;
  Ok local_101;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  size_t local_e8;
  char *pcStack_e0;
  Builder local_d8;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_d0 [3];
  allocator<char> local_b1;
  string local_b0;
  Err local_90;
  size_t local_70;
  char *local_68;
  size_t sStack_60;
  Name name;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2;
  ExternalKind kind_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *exports_local;
  Named *item_local;
  Module *wasm_local;
  Lexer *in_local;
  
  __end2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(exports);
  name.super_IString.str._M_str =
       (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end(exports);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                *)&name.super_IString.str._M_str);
    if (!bVar1) {
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_101);
      return __return_storage_ptr__;
    }
    pNVar2 = __gnu_cxx::
             __normal_iterator<const_wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
             ::operator*(&__end2);
    local_70 = (pNVar2->super_IString).str._M_len;
    local_68 = (pNVar2->super_IString).str._M_str;
    sStack_60 = local_70;
    name.super_IString.str._M_len = (size_t)local_68;
    pEVar3 = Module::getExportOrNull(wasm,(Name)(pNVar2->super_IString).str);
    if (pEVar3 != (Export *)0x0) break;
    Builder::Builder(&local_d8,wasm);
    local_e8 = sStack_60;
    pcStack_e0 = (char *)name.super_IString.str._M_len;
    std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name_const&,void,void,wasm::Name,void>
              ((variant<wasm::Name,wasm::HeapType> *)&local_100,&item->name);
    name_00.super_IString.str._M_str = pcStack_e0;
    name_00.super_IString.str._M_len = local_e8;
    value.super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
    str._M_str = (char *)uStack_f8;
    value.super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
    str._M_len = local_100;
    value.super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_f0;
    Builder::makeExport((Builder *)local_d0,name_00,value,kind);
    Module::addExport(wasm,local_d0);
    std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(local_d0);
    __gnu_cxx::
    __normal_iterator<const_wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
    operator++(&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"repeated export name",&local_b1);
  Lexer::err(&local_90,in,&local_b0);
  Result<wasm::Ok>::Result(__return_storage_ptr__,&local_90);
  wasm::Err::~Err(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  return __return_storage_ptr__;
}

Assistant:

Result<> addExports(Lexer& in,
                    Module& wasm,
                    const Named* item,
                    const std::vector<Name>& exports,
                    ExternalKind kind) {
  for (auto name : exports) {
    if (wasm.getExportOrNull(name)) {
      // TODO: Fix error location
      return in.err("repeated export name");
    }
    wasm.addExport(Builder(wasm).makeExport(name, item->name, kind));
  }
  return Ok{};
}